

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * getBtnsState_abi_cxx11_(void)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  int i;
  string *in_stack_00000020;
  uint32_t in_stack_0000002c;
  GPIOClass *in_stack_00000030;
  undefined1 local_11;
  int local_4;
  
  if (getBtnsState[abi:cxx11]()::sState_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getBtnsState[abi:cxx11]()::sState_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&getBtnsState[abi:cxx11]()::sState_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,&getBtnsState[abi:cxx11]()::sState_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&getBtnsState[abi:cxx11]()::sState_abi_cxx11_);
    }
  }
  __getPinsState(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  local_4 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= (ulong)(long)local_4) break;
    pcVar3 = (char *)std::__cxx11::string::operator[](0x10c4b8);
    local_11 = 0x31;
    if (*pcVar3 != '0') {
      local_11 = 0x30;
    }
    puVar4 = (undefined1 *)std::__cxx11::string::operator[](0x10c4b8);
    *puVar4 = local_11;
    local_4 = local_4 + 1;
  }
  return &getBtnsState[abi:cxx11]()::sState_abi_cxx11_;
}

Assistant:

const string& getBtnsState()
{
    static string sState;
    __getPinsState(btnPool, BTNS_CNT, sState);
	for(int i = 0;i < sState.length(); i++)
	{
		sState[i] = (sState[i] == '0') ? '1' : '0';
	}
    return sState;
}